

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

void symbol_cleanup(lgx_ast_node_t *node)

{
  uint local_1c;
  lgx_ht_node_t *plStack_18;
  int i;
  lgx_ht_node_t *n;
  lgx_ast_node_t *node_local;
  
  if (*(char *)node == '\x01') {
    for (plStack_18 = lgx_ht_first((node->u).symbols); plStack_18 != (lgx_ht_node_t *)0x0;
        plStack_18 = lgx_ht_next(plStack_18)) {
      symbol_del((lgx_symbol_t *)plStack_18->v);
      plStack_18->v = (void *)0x0;
    }
  }
  for (local_1c = 0; local_1c < node->children; local_1c = local_1c + 1) {
    symbol_cleanup(node->child[(int)local_1c]);
  }
  return;
}

Assistant:

static void symbol_cleanup(lgx_ast_node_t* node) {
    if (node->type == BLOCK_STATEMENT) {
        lgx_ht_node_t* n;
        for (n = lgx_ht_first(node->u.symbols); n; n = lgx_ht_next(n)) {
            symbol_del(n->v);
            n->v = NULL;
        }
    }

    int i;
    for (i = 0; i < node->children; ++i) {
        symbol_cleanup(node->child[i]);
    }
}